

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Cast_x86_avx512::forward(Cast_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint _c;
  int _elempack;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  unsigned_short uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  _func_int **pp_Var12;
  size_t sVar13;
  void *pvVar14;
  _func_int *p_Var15;
  undefined1 (*pauVar16) [16];
  undefined1 (*pauVar17) [64];
  void *pvVar18;
  undefined1 (*pauVar19) [64];
  int iVar20;
  int i;
  undefined1 auVar28 [16];
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  undefined1 (*pauVar27) [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  float fVar32;
  undefined1 auVar33 [16];
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  
  p_Var15 = this->_vptr_Cast_x86_avx512[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var15) == *(int *)(&this->field_0xd4 + (long)p_Var15)) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar2 = bottom_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          free(top_blob->data);
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->c = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    piVar2 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar2;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar9 = bottom_blob->w;
    iVar20 = bottom_blob->h;
    iVar1 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar9;
    top_blob->h = iVar20;
    top_blob->d = iVar1;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  iVar9 = bottom_blob->w;
  iVar20 = bottom_blob->h;
  iVar1 = bottom_blob->d;
  _c = bottom_blob->c;
  iVar26 = bottom_blob->dims;
  _elempack = bottom_blob->elempack;
  sVar13 = (size_t)_elempack;
  switch(*(int *)(&this->field_0xd4 + (long)p_Var15)) {
  case 1:
    if (*(int *)(&this->field_0xd0 + (long)p_Var15) == 3) {
      Cast::forward((Cast *)((long)&this->_vptr_Cast_x86_avx512 + (long)p_Var15),bottom_blob,
                    top_blob,opt);
    }
    sVar13 = sVar13 * 4;
    break;
  case 2:
  case 4:
    sVar13 = (size_t)(_elempack * 2);
    break;
  case 3:
    break;
  default:
    sVar13 = bottom_blob->elemsize;
  }
  switch(iVar26) {
  case 1:
    Mat::create(top_blob,iVar9,sVar13,_elempack,opt->blob_allocator);
    break;
  case 2:
    Mat::create(top_blob,iVar9,iVar20,sVar13,_elempack,opt->blob_allocator);
    break;
  case 3:
    Mat::create(top_blob,iVar9,iVar20,_c,sVar13,_elempack,opt->blob_allocator);
    break;
  case 4:
    Mat::create(top_blob,iVar9,iVar20,iVar1,_c,sVar13,_elempack,opt->blob_allocator);
  }
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  pp_Var12 = this->_vptr_Cast_x86_avx512;
  p_Var15 = pp_Var12[-3];
  iVar26 = *(int *)(&this->field_0xd0 + (long)p_Var15);
  if (iVar26 == 1) {
    if (*(int *)(&this->field_0xd4 + (long)p_Var15) == 2) {
      iVar26 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar11 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar11 = 0;
      }
      for (uVar10 = 0; uVar10 != uVar11; uVar10 = uVar10 + 1) {
        pauVar17 = (undefined1 (*) [64])
                   (bottom_blob->cstep * uVar10 * bottom_blob->elemsize + (long)bottom_blob->data);
        pauVar16 = (undefined1 (*) [16])
                   (top_blob->cstep * uVar10 * top_blob->elemsize + (long)top_blob->data);
        for (iVar25 = 0; iVar25 + 0xf < iVar26; iVar25 = iVar25 + 0x10) {
          auVar30 = vmovdqu64_avx512f(*pauVar17);
          auVar28 = vcvtps2ph_avx512vl(auVar30._0_16_,0);
          *(long *)*pauVar16 = auVar28._0_8_;
          *(undefined8 *)(*pauVar16 + 8) = 0;
          *(undefined8 *)pauVar16[1] = 0;
          *(undefined8 *)(pauVar16[1] + 8) = 0;
          pauVar17 = pauVar17 + 1;
          pauVar16 = pauVar16 + 2;
        }
        for (; iVar25 + 7 < iVar26; iVar25 = iVar25 + 8) {
          auVar28 = vcvtps2ph_f16c(*(undefined1 (*) [32])*pauVar17,8);
          *pauVar16 = auVar28;
          pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x20);
          pauVar16 = pauVar16 + 1;
        }
        for (; iVar25 + 3 < iVar26; iVar25 = iVar25 + 4) {
          vcvtps2ph_f16c(*(undefined1 (*) [16])*pauVar17,8);
          pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x10);
          pauVar16 = (undefined1 (*) [16])(*pauVar16 + 8);
        }
        lVar23 = 0;
        for (; iVar25 < iVar26; iVar25 = iVar25 + 1) {
          uVar8 = float32_to_float16(*(float *)(*pauVar17 + lVar23 * 2));
          *(unsigned_short *)(*pauVar16 + lVar23) = uVar8;
          lVar23 = lVar23 + 2;
        }
      }
      pp_Var12 = this->_vptr_Cast_x86_avx512;
      p_Var15 = pp_Var12[-3];
      iVar26 = *(int *)(&this->field_0xd0 + (long)p_Var15);
      goto LAB_00446872;
    }
  }
  else {
LAB_00446872:
    if (iVar26 == 2) {
      if (*(int *)(&this->field_0xd4 + (long)p_Var15) != 1) goto LAB_00446adc;
      iVar26 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar11 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar11 = 0;
      }
      for (uVar10 = 0; uVar10 != uVar11; uVar10 = uVar10 + 1) {
        pauVar27 = (undefined1 (*) [32])
                   (bottom_blob->cstep * uVar10 * bottom_blob->elemsize + (long)bottom_blob->data);
        pauVar17 = (undefined1 (*) [64])
                   (top_blob->cstep * uVar10 * top_blob->elemsize + (long)top_blob->data);
        for (iVar25 = 0; iVar25 + 0xf < iVar26; iVar25 = iVar25 + 0x10) {
          auVar30 = vcvtph2ps_avx512f(*pauVar27);
          *pauVar17 = auVar30;
          pauVar27 = pauVar27 + 1;
          pauVar17 = pauVar17 + 1;
        }
        for (; iVar25 + 7 < iVar26; iVar25 = iVar25 + 8) {
          auVar29 = vcvtph2ps_f16c(*(undefined1 (*) [16])*pauVar27);
          *(undefined1 (*) [32])*pauVar17 = auVar29;
          pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
          pauVar17 = (undefined1 (*) [64])((long)*pauVar17 + 0x20);
        }
        for (; iVar25 + 3 < iVar26; iVar25 = iVar25 + 4) {
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(ulong *)*pauVar27;
          auVar28 = vcvtph2ps_f16c(auVar28);
          *(undefined1 (*) [16])*pauVar17 = auVar28;
          pauVar27 = (undefined1 (*) [32])(*pauVar27 + 8);
          pauVar17 = (undefined1 (*) [64])((long)*pauVar17 + 0x10);
        }
        lVar23 = 0;
        for (; iVar25 < iVar26; iVar25 = iVar25 + 1) {
          fVar32 = float16_to_float32(*(unsigned_short *)(*pauVar27 + lVar23));
          *(float *)((long)*pauVar17 + lVar23 * 2) = fVar32;
          lVar23 = lVar23 + 2;
        }
      }
      pp_Var12 = this->_vptr_Cast_x86_avx512;
      p_Var15 = pp_Var12[-3];
      iVar26 = *(int *)(&this->field_0xd0 + (long)p_Var15);
    }
    if (iVar26 == 3) {
      if (*(int *)(&this->field_0xd4 + (long)p_Var15) != 1) goto LAB_00446adc;
      uVar24 = iVar1 * _elempack * iVar20 * iVar9;
      pvVar14 = bottom_blob->data;
      sVar13 = bottom_blob->cstep;
      pvVar18 = top_blob->data;
      sVar3 = top_blob->cstep;
      sVar4 = top_blob->elemsize;
      uVar10 = 0;
      uVar11 = (ulong)uVar24;
      if ((int)uVar24 < 1) {
        uVar11 = uVar10;
      }
      uVar22 = (ulong)_c;
      if ((int)_c < 1) {
        uVar22 = uVar10;
      }
      sVar5 = bottom_blob->elemsize;
      for (; uVar10 != uVar22; uVar10 = uVar10 + 1) {
        for (uVar21 = 0; uVar11 != uVar21; uVar21 = uVar21 + 1) {
          *(float *)((long)pvVar18 + uVar21 * 4) = (float)(int)*(char *)((long)pvVar14 + uVar21);
        }
        pvVar18 = (void *)((long)pvVar18 + sVar3 * sVar4);
        pvVar14 = (void *)((long)pvVar14 + sVar13 * sVar5);
      }
      p_Var15 = pp_Var12[-3];
      iVar26 = *(int *)(&this->field_0xd0 + (long)p_Var15);
    }
    if (iVar26 != 1) goto LAB_00446adc;
  }
  if (*(int *)(&this->field_0xd4 + (long)p_Var15) == 4) {
    iVar9 = cpu_support_x86_avx512_bf16();
    if (iVar9 == 0) {
      iVar9 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar10 = 0;
      uVar11 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar11 = uVar10;
      }
      auVar30 = vpmovsxbw_avx512bw(_DAT_004f7bf9);
      for (; uVar10 != uVar11; uVar10 = uVar10 + 1) {
        pauVar17 = (undefined1 (*) [64])
                   (bottom_blob->cstep * uVar10 * bottom_blob->elemsize + (long)bottom_blob->data);
        pauVar19 = (undefined1 (*) [64])
                   (top_blob->cstep * uVar10 * top_blob->elemsize + (long)top_blob->data);
        for (iVar20 = 0; iVar20 + 0x1f < iVar9; iVar20 = iVar20 + 0x20) {
          auVar31 = vmovdqu64_avx512f(*pauVar17);
          auVar31 = vpermt2w_avx512bw(auVar31,auVar30,pauVar17[1]);
          auVar31 = vmovdqu64_avx512f(auVar31);
          *pauVar19 = auVar31;
          pauVar17 = pauVar17 + 2;
          pauVar19 = pauVar19 + 1;
        }
        for (; iVar20 + 0xf < iVar9; iVar20 = iVar20 + 0x10) {
          auVar31 = vpsrld_avx512f(*pauVar17,0x10);
          auVar29 = vpmovdw_avx512f(auVar31);
          *(undefined1 (*) [32])*pauVar19 = auVar29;
          pauVar17 = pauVar17 + 1;
          pauVar19 = (undefined1 (*) [64])(*pauVar19 + 0x20);
        }
        for (; iVar20 + 7 < iVar9; iVar20 = iVar20 + 8) {
          auVar29 = vpsrld_avx512vl(*(undefined1 (*) [32])*pauVar17,0x10);
          auVar28 = vpackusdw_avx(auVar29._0_16_,auVar29._16_16_);
          *(undefined1 (*) [16])*pauVar19 = auVar28;
          pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x20);
          pauVar19 = (undefined1 (*) [64])(*pauVar19 + 0x10);
        }
        lVar23 = 0;
        for (; iVar20 < iVar9; iVar20 = iVar20 + 1) {
          *(undefined2 *)(*pauVar19 + lVar23 * 2) = *(undefined2 *)(*pauVar17 + lVar23 * 4 + 2);
          lVar23 = lVar23 + 1;
        }
      }
    }
    else {
      cast_fp32_to_bf16_sse_avx512bf16(bottom_blob,top_blob,opt);
    }
  }
LAB_00446adc:
  if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx512[-3]) == 4) &&
     (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx512[-3]) == 1)) {
    uVar34 = 0;
    uVar35 = 0;
    uVar36 = 0;
    uVar37 = 0;
    iVar9 = cpu_support_x86_avx512_bf16();
    if (iVar9 == 0) {
      iVar9 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar11 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar11 = 0;
      }
      for (uVar10 = 0; uVar10 != uVar11; uVar10 = uVar10 + 1) {
        pauVar27 = (undefined1 (*) [32])
                   (bottom_blob->cstep * uVar10 * bottom_blob->elemsize + (long)bottom_blob->data);
        pauVar17 = (undefined1 (*) [64])
                   (top_blob->cstep * uVar10 * top_blob->elemsize + (long)top_blob->data);
        for (iVar20 = 0; iVar20 + 0xf < iVar9; iVar20 = iVar20 + 0x10) {
          auVar6 = vpunpcklwd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),*pauVar27);
          auVar29 = vpunpckhwd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),*pauVar27);
          auVar28 = ZEXT116(0) * auVar6._16_16_ + ZEXT116(1) * auVar29._0_16_;
          auVar7 = vperm2i128_avx2(auVar6,auVar29,0x31);
          auVar30._16_8_ = auVar28._0_8_;
          auVar30._0_16_ = ZEXT116(0) * auVar29._0_16_ + ZEXT116(1) * auVar6._0_16_;
          auVar30._24_8_ = auVar28._8_8_;
          auVar30._32_8_ = uVar34;
          auVar30._40_8_ = uVar35;
          auVar30._48_8_ = uVar36;
          auVar30._56_8_ = uVar37;
          auVar30 = vinserti64x4_avx512f(auVar30,auVar7,1);
          auVar30 = vmovdqu64_avx512f(auVar30);
          *pauVar17 = auVar30;
          pauVar27 = pauVar27 + 1;
          pauVar17 = pauVar17 + 1;
        }
        for (; iVar20 + 7 < iVar9; iVar20 = iVar20 + 8) {
          auVar33 = vpunpcklwd_avx((undefined1  [16])0x0,*(undefined1 (*) [16])*pauVar27);
          auVar28 = vpunpckhwd_avx((undefined1  [16])0x0,*(undefined1 (*) [16])*pauVar27);
          *(undefined1 (*) [16])(*pauVar17 + 0x10) = auVar28;
          *(undefined1 (*) [16])*pauVar17 = auVar33;
          pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
          pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x20);
        }
        for (; iVar20 + 3 < iVar9; iVar20 = iVar20 + 4) {
          auVar33._8_8_ = 0;
          auVar33._0_8_ = *(ulong *)*pauVar27;
          auVar28 = vpunpcklwd_avx((undefined1  [16])0x0,auVar33);
          *(undefined1 (*) [16])*pauVar17 = auVar28;
          pauVar27 = (undefined1 (*) [32])(*pauVar27 + 8);
          pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x10);
        }
        lVar23 = 0;
        for (; iVar20 < iVar9; iVar20 = iVar20 + 1) {
          *(uint *)(*pauVar17 + lVar23 * 2) = (uint)*(ushort *)(*pauVar27 + lVar23) << 0x10;
          lVar23 = lVar23 + 2;
        }
      }
    }
    else {
      cast_bf16_to_fp32_sse_avx512bf16(bottom_blob,top_blob,opt);
    }
  }
  return 0;
}

Assistant:

int Cast_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}